

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

void MutableS2ShapeIndex::ClipVAxis
               (ClippedEdge *edge,R1Interval *middle,
               vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               *child_edges,EdgeAllocator *alloc)

{
  pointer *pppCVar1;
  double v;
  iterator iVar2;
  ClippedEdge *local_28;
  ClippedEdge *local_20;
  
  local_20 = edge;
  if ((edge->bound).bounds_[1].bounds_.c_[1] <= (middle->bounds_).c_[0]) {
    iVar2._M_current =
         (child_edges->
         super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current !=
        (child_edges->
        super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      *iVar2._M_current = edge;
      pppCVar1 = &(child_edges->
                  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
      return;
    }
LAB_001951d7:
    std::
    vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
    ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*const&>
              ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                *)child_edges,iVar2,&local_20);
  }
  else {
    v = (middle->bounds_).c_[1];
    if (v <= (edge->bound).bounds_[1].bounds_.c_[0]) {
      iVar2._M_current =
           child_edges[1].
           super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          child_edges[1].
          super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        child_edges = child_edges + 1;
        goto LAB_001951d7;
      }
      *iVar2._M_current = edge;
    }
    else {
      local_28 = ClipVBound(edge,1,v,alloc);
      iVar2._M_current =
           (child_edges->
           super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (child_edges->
          super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
        ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                  ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                    *)child_edges,iVar2,&local_28);
      }
      else {
        *iVar2._M_current = local_28;
        pppCVar1 = &(child_edges->
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      local_28 = ClipVBound(local_20,0,(middle->bounds_).c_[0],alloc);
      iVar2._M_current =
           child_edges[1].
           super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          child_edges[1].
          super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
        ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                  ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                    *)(child_edges + 1),iVar2,&local_28);
        return;
      }
      *iVar2._M_current = local_28;
    }
    pppCVar1 = &child_edges[1].
                super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return;
}

Assistant:

inline void MutableS2ShapeIndex::ClipVAxis(
    const ClippedEdge* edge,
    const R1Interval& middle,
    vector<const ClippedEdge*> child_edges[2],
    EdgeAllocator* alloc) {
  if (edge->bound[1].hi() <= middle.lo()) {
    // Edge is entirely contained in the lower child.
    child_edges[0].push_back(edge);
  } else if (edge->bound[1].lo() >= middle.hi()) {
    // Edge is entirely contained in the upper child.
    child_edges[1].push_back(edge);
  } else {
    // The edge bound spans both children.
    child_edges[0].push_back(ClipVBound(edge, 1, middle.hi(), alloc));
    child_edges[1].push_back(ClipVBound(edge, 0, middle.lo(), alloc));
  }
}